

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O3

bool __thiscall
QPointingDevicePrivate::addPassiveGrabber
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point,QObject *grabber)

{
  QObject *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  QExplicitlySharedDataPointer<QEventPointPrivate> this_00;
  bool bVar6;
  int t;
  undefined8 uVar7;
  QDebug *pQVar8;
  long lVar9;
  long lVar10;
  QObject *pQVar11;
  void *pvVar12;
  QMovableArrayOps<QPointer<QObject>> *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  const_iterator cVar14;
  QDebug local_b8;
  Stream *local_b0;
  QDebug local_a8;
  QEventPoint local_a0;
  undefined1 local_98 [8];
  QDebug local_90 [3];
  QExplicitlySharedDataPointer<QEventPointPrivate> local_78;
  undefined4 local_6c;
  QPointer<QObject> local_68;
  undefined8 uStack_58;
  QExplicitlySharedDataPointer<QEventPointPrivate> *local_50;
  QEventPoint *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QInputDevicePrivate).field_0x8;
  local_68.wp.d._0_4_ = QEventPoint::id(point);
  cVar14 = QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
           ::find(&this->activePoints,(int *)&local_68);
  lVar9 = cVar14.i;
  if ((lVar9 == (this->activePoints).c.keys.super_QVLABase<int>.super_QVLABaseBase.s) ||
     (pvVar12 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>
                .super_QVLABaseBase.ptr, pvVar12 == (void *)0x0)) {
    local_68.wp.d._0_4_ = 2;
    local_68.wp.d._4_4_ = 0;
    local_68.wp.value._0_4_ = 0;
    local_68.wp.value._4_4_ = 0;
    uStack_58._0_4_ = 0;
    uStack_58._4_4_ = 0;
    local_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)0x6a102e;
    QMessageLogger::warning();
    this_00.d.ptr = local_78.d.ptr;
    QVar13.m_data = (storage_type *)0x1c;
    QVar13.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)this_00.d.ptr,(QString *)local_90);
    if (local_90[0].stream != (Stream *)0x0) {
      LOCK();
      *(int *)local_90[0].stream = *(int *)local_90[0].stream + -1;
      UNLOCK();
      if (*(int *)local_90[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_90[0].stream,2,0x10);
      }
    }
    if (*(char *)&((QPointF *)((long)local_78.d.ptr + 0x30))->xp == '\x01') {
      QTextStream::operator<<((QTextStream *)local_78.d.ptr,' ');
    }
    local_a0.d.d.ptr =
         (QExplicitlySharedDataPointer<QEventPointPrivate>)
         (QExplicitlySharedDataPointer<QEventPointPrivate>)local_78.d.ptr;
    *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d =
         *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d + 1;
    ::operator<<((Stream *)local_98,&local_a0);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)&local_a0);
    QDebug::~QDebug((QDebug *)&local_78);
LAB_0030d6ea:
    bVar6 = false;
  }
  else {
    this_01 = (QMovableArrayOps<QPointer<QObject>> *)((long)pvVar12 + lVar9 * 0x58 + 0x28);
    lVar2 = *(long *)((long)pvVar12 + lVar9 * 0x58 + 0x38);
    if (lVar2 != 0) {
      lVar3 = *(long *)((long)pvVar12 + lVar9 * 0x58 + 0x30);
      lVar10 = 0;
      do {
        if (lVar2 << 4 == lVar10) goto LAB_0030d569;
        lVar4 = *(long *)(lVar3 + lVar10);
        if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
          pQVar11 = (QObject *)0x0;
        }
        else {
          pQVar11 = *(QObject **)(lVar3 + 8 + lVar10);
        }
        lVar10 = lVar10 + 0x10;
      } while (pQVar11 != grabber);
      if (lVar10 != 0) goto LAB_0030d6ea;
    }
LAB_0030d569:
    QtPrivateLogging::lcPointerGrab();
    if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value._M_base
               ._M_i & 1) != 0) {
      QtPrivateLogging::lcPointerGrab();
      if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                 _M_base._M_i & 1) != 0) {
        local_68.wp.d._0_4_ = 2;
        local_68.wp.d._4_4_ = 0;
        local_68.wp.value._0_4_ = 0;
        local_68.wp.value._4_4_ = 0;
        uStack_58._0_4_ = 0;
        uStack_58._4_4_ = 0;
        local_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)
                   QtPrivateLogging::lcPointerGrab::category.name;
        QMessageLogger::debug();
        pQVar8 = QDebug::operator<<((QDebug *)&local_78,&(this->super_QInputDevicePrivate).name);
        pQVar8 = QDebug::operator<<(pQVar8,"point");
        t = QEventPoint::id(point);
        pQVar8 = QDebug::operator<<(pQVar8,t);
        local_b8.stream = pQVar8->stream;
        (local_b8.stream)->ref = (local_b8.stream)->ref + 1;
        QEventPoint::state(point);
        ::operator<<((Stream *)local_90,(State)&local_b8);
        pQVar8 = QDebug::operator<<(local_90,": grab (passive)");
        local_b0 = pQVar8->stream;
        local_b0->ref = local_b0->ref + 1;
        ::operator<<((QDebug *)&local_a8,(QObject *)&local_b0);
        QDebug::~QDebug(&local_a8);
        QDebug::~QDebug((QDebug *)&local_b0);
        QDebug::~QDebug(local_90);
        QDebug::~QDebug(&local_b8);
        QDebug::~QDebug((QDebug *)&local_78);
      }
    }
    if (grabber == (QObject *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef(grabber);
    }
    local_68.wp.d._0_4_ = (int)uVar7;
    local_68.wp.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    local_68.wp.value = grabber;
    QtPrivate::QMovableArrayOps<QPointer<QObject>>::emplace<QPointer<QObject>>
              (this_01,*(qsizetype *)((long)pvVar12 + lVar9 * 0x58 + 0x38),&local_68);
    QList<QPointer<QObject>_>::end((QList<QPointer<QObject>_> *)this_01);
    piVar5 = (int *)CONCAT44(local_68.wp.d._4_4_,(int)local_68.wp.d);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pvVar12 = (void *)CONCAT44(local_68.wp.d._4_4_,(int)local_68.wp.d);
        if (pvVar12 == (void *)0x0) {
          pvVar12 = (void *)0x0;
        }
        operator_delete(pvVar12);
      }
    }
    local_68.wp.value = (QObject *)local_90;
    uStack_58 = &local_6c;
    local_6c = 1;
    local_50 = &local_78;
    local_68.wp.d._0_4_ = 0;
    local_68.wp.d._4_4_ = 0;
    local_90[0].stream = (Stream *)grabber;
    local_78.d.ptr =
         (totally_ordered_wrapper<QEventPointPrivate_*>)
         (totally_ordered_wrapper<QEventPointPrivate_*>)event;
    local_48 = point;
    QMetaObject::activate(pQVar1,&QPointingDevice::staticMetaObject,0,(void **)&local_68);
    bVar6 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QPointingDevicePrivate::addPassiveGrabber(const QPointerEvent *event, const QEventPoint &point, QObject *grabber)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return false;
    }
    if (persistentPoint->passiveGrabbers.contains(grabber))
        return false;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": grab (passive)" << grabber;
    }
    persistentPoint->passiveGrabbers << grabber;
    emit q->grabChanged(grabber, QPointingDevice::GrabPassive, event, point);
    return true;
}